

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_grasshopper_core.c
# Opt level: O3

void grasshopper_set_encrypt_key(grasshopper_round_keys_t *subkeys,grasshopper_key_t *key)

{
  byte bVar1;
  byte bVar2;
  int i;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  uint j;
  int iVar6;
  uint64_t uVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  byte bVar11;
  byte bStack_69;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  
  local_68 = (key->k).q[0];
  local_60 = (key->k).q[1];
  uVar4 = (key->k).q[2];
  uVar7 = (key->k).q[3];
  subkeys->k[0].q[0] = local_68;
  subkeys->k[0].q[1] = local_60;
  subkeys->k[1].q[0] = uVar4;
  *(uint64_t *)((long)subkeys->k + 0x18) = uVar7;
  uVar9 = 1;
  do {
    uVar5 = local_60;
    uVar3 = local_68;
    local_58 = 0;
    uStack_50 = uVar9 << 0x38;
    iVar6 = 0;
    do {
      lVar10 = 0xf;
      bVar11 = uStack_50._7_1_;
      do {
        bVar1 = *(byte *)((long)&local_60 + lVar10 + 7);
        bVar2 = 0;
        *(byte *)((long)&local_58 + lVar10) = bVar1;
        if (((ulong)bVar1 != 0) && (grasshopper_pi_inv[lVar10 + 0xff] != 0)) {
          bVar2 = grasshopper_galois_alpha_to
                  [(ushort)((ushort)grasshopper_galois_index_of[grasshopper_pi_inv[lVar10 + 0xff]] +
                           (ushort)grasshopper_galois_index_of[bVar1]) % 0xff];
        }
        bVar11 = bVar11 ^ bVar2;
        lVar10 = lVar10 + -1;
      } while (lVar10 != 0);
      local_58 = (ulong)bVar11;
      iVar6 = iVar6 + 1;
    } while (iVar6 != 0x10);
    local_68 = local_58 ^ uVar3;
    local_60 = uStack_50 ^ uVar5;
    lVar10 = 0;
    do {
      *(uint8_t *)((long)&local_68 + lVar10) = grasshopper_pi[*(byte *)((long)&local_68 + lVar10)];
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x10);
    iVar6 = 0;
    do {
      lVar10 = 0xf;
      bVar11 = local_60._7_1_;
      do {
        bVar1 = (&bStack_69)[lVar10];
        bVar2 = 0;
        *(byte *)((long)&local_68 + lVar10) = bVar1;
        if (((ulong)bVar1 != 0) && (grasshopper_pi_inv[lVar10 + 0xff] != 0)) {
          bVar2 = grasshopper_galois_alpha_to
                  [(ushort)((ushort)grasshopper_galois_index_of[grasshopper_pi_inv[lVar10 + 0xff]] +
                           (ushort)grasshopper_galois_index_of[bVar1]) % 0xff];
        }
        bVar11 = bVar11 ^ bVar2;
        lVar10 = lVar10 + -1;
      } while (lVar10 != 0);
      local_68 = CONCAT71(local_68._1_7_,bVar11);
      iVar6 = iVar6 + 1;
    } while (iVar6 != 0x10);
    local_68 = uVar4 ^ local_68;
    local_60 = uVar7 ^ local_60;
    if ((uVar9 & 7) == 0) {
      uVar4 = uVar9 >> 2;
      subkeys->k[uVar4].q[0] = local_68;
      *(ulong *)((long)subkeys->k + uVar4 * 0x10 + 8) = local_60;
      uVar4 = (ulong)((uint)uVar4 | 1);
      subkeys->k[uVar4].q[0] = uVar3;
      *(ulong *)((long)subkeys->k + uVar4 * 0x10 + 8) = uVar5;
    }
    uVar8 = (int)uVar9 + 1;
    uVar9 = (ulong)uVar8;
    uVar4 = uVar3;
    uVar7 = uVar5;
  } while (uVar8 != 0x21);
  return;
}

Assistant:

void grasshopper_set_encrypt_key(grasshopper_round_keys_t* subkeys, const grasshopper_key_t* key) {
    grasshopper_w128_t c, x, y, z;
    int i;

    for (i = 0; i < 16; i++) {
        // this will be have to changed for little-endian systems
        x.b[i] = key->k.b[i];
        y.b[i] = key->k.b[i + 16];
    }

    grasshopper_copy128(&subkeys->k[0], &x);
    grasshopper_copy128(&subkeys->k[1], &y);

    for (i = 1; i <= 32; i++) {

        // C Value
        grasshopper_zero128(&c);
        c.b[15] = (uint8_t) i;        // load round in lsb
        grasshopper_l(&c);

        grasshopper_plus128(&z, &x, &c);
        grasshopper_convert128(&z, grasshopper_pi);
        grasshopper_l(&z);
        grasshopper_append128(&z, &y);

        grasshopper_copy128(&y, &x);
        grasshopper_copy128(&x, &z);

        if ((i & 7) == 0) {
            int k = i >> 2;
            grasshopper_copy128(&subkeys->k[k], &x);
            grasshopper_copy128(&subkeys->k[k + 1], &y);
        }
    }

    // security++
    grasshopper_zero128(&c);
    grasshopper_zero128(&x);
    grasshopper_zero128(&y);
    grasshopper_zero128(&z);
}